

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.cpp
# Opt level: O0

void asmjit::DebugUtils::assertionFailed(char *file,int line,char *msg)

{
  undefined8 in_RDX;
  uint in_ESI;
  undefined8 in_RDI;
  char str [1024];
  char acStack_418 [1023];
  undefined1 local_19;
  
  snprintf(acStack_418,0x400,"[asmjit] Assertion failed at %s (line %d):\n[asmjit] %s\n",in_RDI,
           (ulong)in_ESI,in_RDX);
  local_19 = 0;
  debugOutput((char *)0x120fdc);
  abort();
}

Assistant:

ASMJIT_FAVOR_SIZE void DebugUtils::assertionFailed(const char* file, int line, const char* msg) noexcept {
  char str[1024];

  snprintf(str, 1024,
    "[asmjit] Assertion failed at %s (line %d):\n"
    "[asmjit] %s\n", file, line, msg);

  // Support buggy `snprintf` implementations.
  str[1023] = '\0';

  debugOutput(str);
  ::abort();
}